

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * __thiscall
kj::_::Debug::makeDescription<char_const(&)[25],unsigned_int&,kj::StringPtr&>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,char (*params) [25],
          uint *params_1,StringPtr *params_2)

{
  uint *params_00;
  StringPtr *params_01;
  ArrayPtr<kj::String> AVar1;
  ArrayPtr<kj::String> argValues_00;
  ArrayDisposer **local_d0;
  undefined1 local_78 [8];
  String argValues [3];
  StringPtr *params_local_2;
  uint *params_local_1;
  char (*params_local) [25];
  char *macroArgs_local;
  
  argValues[2].content.disposer = (ArrayDisposer *)params_1;
  str<char_const(&)[25]>((String *)local_78,(kj *)macroArgs,(char (*) [25])macroArgs);
  str<unsigned_int&>((String *)&argValues[0].content.disposer,(kj *)params,params_00);
  str<kj::StringPtr&>((String *)&argValues[1].content.disposer,(kj *)argValues[2].content.disposer,
                      params_01);
  AVar1 = arrayPtr<kj::String>((String *)local_78,3);
  argValues_00.size_ = (size_t)params_1;
  argValues_00.ptr = (String *)AVar1.size_;
  makeDescriptionInternal(__return_storage_ptr__,this,(char *)AVar1.ptr,argValues_00);
  local_d0 = &argValues[2].content.disposer;
  do {
    local_d0 = local_d0 + -3;
    String::~String((String *)local_d0);
  } while (local_d0 != (ArrayDisposer **)local_78);
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}